

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O2

ssize_t __thiscall avro::BufferReader::read(BufferReader *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  _Elt_pointer pCVar2;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined4 in_register_00000034;
  
  pvVar1 = (void *)this->bytesRemaining_;
  if (__buf <= pvVar1) {
    pCVar2 = (this->iter_)._M_cur;
    if (pCVar2->writePos_ + -(long)(pCVar2->readPos_ + this->chunkPos_) < __buf) {
      slowStringRead(this,(string *)CONCAT44(in_register_00000034,__fd),(size_type)__buf);
      in_RAX = extraout_RAX;
    }
    else {
      fastStringRead(this,(string *)CONCAT44(in_register_00000034,__fd),(size_type)__buf);
      in_RAX = extraout_RAX_00;
    }
  }
  return CONCAT71((int7)((ulong)in_RAX >> 8),__buf <= pvVar1);
}

Assistant:

bool read(std::string &str, size_type size) { 
        if(size > bytesRemaining_) {
            return false;
        }

        if(size <= chunkRemaining()) {
            fastStringRead(str, size);
        }
        else {
            slowStringRead(str, size);
        }

        return true;
    }